

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_audio_buffer_init_ex
                    (ma_audio_buffer_config *pConfig,ma_bool32 doCopy,ma_audio_buffer *pAudioBuffer)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  void *__src;
  ma_uint64 mVar2;
  ma_format mVar3;
  ma_uint32 mVar4;
  void *p;
  ma_data_source_base *pDataSourceBase;
  ma_result mVar5;
  ma_bool32 mVar6;
  
  mVar5 = MA_INVALID_ARGS;
  if (((pAudioBuffer != (ma_audio_buffer *)0x0) &&
      (memset(pAudioBuffer,0,0x97), pConfig != (ma_audio_buffer_config *)0x0)) &&
     (pConfig->sizeInFrames != 0)) {
    mVar3 = pConfig->format;
    mVar4 = pConfig->channels;
    (pAudioBuffer->ref).ds.rangeBegInFrames = 0;
    (pAudioBuffer->ref).ds.rangeEndInFrames = 0;
    (pAudioBuffer->ref).ds.loopBegInFrames = 0;
    (pAudioBuffer->ref).ds.loopEndInFrames = 0;
    (pAudioBuffer->ref).ds.pCurrent = (ma_data_source *)0x0;
    (pAudioBuffer->ref).ds.pNext = (ma_data_source *)0x0;
    (pAudioBuffer->ref).ds.onGetNext = (ma_data_source_get_next_proc)0x0;
    *(undefined8 *)&(pAudioBuffer->ref).ds.isLooping = 0;
    (pAudioBuffer->ref).format = ma_format_unknown;
    (pAudioBuffer->ref).channels = 0;
    *(undefined8 *)&(pAudioBuffer->ref).sampleRate = 0;
    (pAudioBuffer->ref).ds.vtable = &g_ma_audio_buffer_ref_data_source_vtable;
    (pAudioBuffer->ref).ds.rangeEndInFrames = 0xffffffffffffffff;
    (pAudioBuffer->ref).ds.loopEndInFrames = 0xffffffffffffffff;
    (pAudioBuffer->ref).ds.pCurrent = pAudioBuffer;
    (pAudioBuffer->ref).ds.pNext = (ma_data_source *)0x0;
    (pAudioBuffer->ref).ds.onGetNext = (ma_data_source_get_next_proc)0x0;
    (pAudioBuffer->ref).format = mVar3;
    (pAudioBuffer->ref).channels = mVar4;
    (pAudioBuffer->ref).cursor = 0;
    (pAudioBuffer->ref).sizeInFrames = 0;
    (pAudioBuffer->ref).pData = (void *)0x0;
    (pAudioBuffer->ref).sampleRate = pConfig->sampleRate;
    ma_allocation_callbacks_init_copy
              (&pAudioBuffer->allocationCallbacks,&pConfig->allocationCallbacks);
    if (doCopy == 0) {
      p = pConfig->pData;
      mVar6 = 0;
    }
    else {
      p_Var1 = (pAudioBuffer->allocationCallbacks).onMalloc;
      if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
      p = (*p_Var1)((ulong)(pConfig->channels * *(int *)(&DAT_00176420 + (ulong)pConfig->format * 4)
                           ) * pConfig->sizeInFrames,(pAudioBuffer->allocationCallbacks).pUserData);
      if (p == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
      __src = pConfig->pData;
      if (__src == (void *)0x0) {
        ma_silence_pcm_frames(p,pConfig->sizeInFrames,pConfig->format,pConfig->channels);
        mVar6 = 1;
      }
      else {
        mVar6 = 1;
        if (p != __src) {
          memcpy(p,__src,(ulong)(*(int *)(&DAT_00176420 + (ulong)pConfig->format * 4) *
                                pConfig->channels) * pConfig->sizeInFrames);
        }
      }
    }
    mVar2 = pConfig->sizeInFrames;
    (pAudioBuffer->ref).cursor = 0;
    (pAudioBuffer->ref).sizeInFrames = mVar2;
    (pAudioBuffer->ref).pData = p;
    pAudioBuffer->ownsData = mVar6;
    mVar5 = MA_SUCCESS;
  }
  return mVar5;
}

Assistant:

static ma_result ma_audio_buffer_init_ex(const ma_audio_buffer_config* pConfig, ma_bool32 doCopy, ma_audio_buffer* pAudioBuffer)
{
    ma_result result;

    if (pAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_MEMORY(pAudioBuffer, sizeof(*pAudioBuffer) - sizeof(pAudioBuffer->_pExtraData));   /* Safety. Don't overwrite the extra data. */

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->sizeInFrames == 0) {
        return MA_INVALID_ARGS; /* Not allowing buffer sizes of 0 frames. */
    }

    result = ma_audio_buffer_ref_init(pConfig->format, pConfig->channels, NULL, 0, &pAudioBuffer->ref);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* TODO: Version 0.12. Set this in ma_audio_buffer_ref_init() instead of here. */
    pAudioBuffer->ref.sampleRate = pConfig->sampleRate;

    ma_allocation_callbacks_init_copy(&pAudioBuffer->allocationCallbacks, &pConfig->allocationCallbacks);

    if (doCopy) {
        ma_uint64 allocationSizeInBytes;
        void* pData;

        allocationSizeInBytes = pConfig->sizeInFrames * ma_get_bytes_per_frame(pConfig->format, pConfig->channels);
        if (allocationSizeInBytes > MA_SIZE_MAX) {
            return MA_OUT_OF_MEMORY;    /* Too big. */
        }

        pData = ma_malloc((size_t)allocationSizeInBytes, &pAudioBuffer->allocationCallbacks);   /* Safe cast to size_t. */
        if (pData == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        if (pConfig->pData != NULL) {
            ma_copy_pcm_frames(pData, pConfig->pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
        } else {
            ma_silence_pcm_frames(pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
        }

        ma_audio_buffer_ref_set_data(&pAudioBuffer->ref, pData, pConfig->sizeInFrames);
        pAudioBuffer->ownsData = MA_TRUE;
    } else {
        ma_audio_buffer_ref_set_data(&pAudioBuffer->ref, pConfig->pData, pConfig->sizeInFrames);
        pAudioBuffer->ownsData = MA_FALSE;
    }

    return MA_SUCCESS;
}